

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computer.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
indk::Computer::doCompareCPFunction
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CP,
          vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CPf)

{
  Position *L_00;
  size_type sVar1;
  reference ppPVar2;
  float local_4c;
  size_type local_48;
  longlong i;
  ulong local_30;
  int64_t L;
  vector<indk::Position_*,_std::allocator<indk::Position_*>_> *local_20;
  vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CPf_local;
  vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CP_local;
  vector<float,_std::allocator<float>_> *R;
  
  L._7_1_ = 0;
  local_20 = CPf;
  CPf_local = CP;
  CP_local = (vector<indk::Position_*,_std::allocator<indk::Position_*>_> *)__return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  local_30 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::size(CP);
  sVar1 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::size(CPf);
  if (sVar1 < local_30) {
    local_30 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::size(CPf);
  }
  std::vector<float,_std::allocator<float>_>::reserve(__return_storage_ptr__,local_30);
  for (local_48 = 0; (long)local_48 < (long)local_30; local_48 = local_48 + 1) {
    ppPVar2 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::operator[]
                        (CP,local_48);
    L_00 = *ppPVar2;
    ppPVar2 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::operator[]
                        (CPf,local_48);
    local_4c = Position::getDistance(L_00,*ppPVar2);
    std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,&local_4c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> indk::Computer::doCompareCPFunction(std::vector<indk::Position*> CP, std::vector<indk::Position*> CPf) {
    std::vector<float> R;
    int64_t L = CP.size();
    if (CPf.size() < L) L = CPf.size();
    R.reserve(L);
    for (long long i = 0; i < L; i++) R.push_back(indk::Position::getDistance(CP[i], CPf[i]));
    return R;
}